

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsAdvDiff_ASAi_bnd.c
# Opt level: O0

int JacB(sunrealtype tB,N_Vector u,N_Vector uB,N_Vector fuB,SUNMatrix JB,void *user_dataB,
        N_Vector tmp1B,N_Vector tmp2B,N_Vector tmp3B)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  undefined8 in_RCX;
  long in_R8;
  UserData data;
  sunrealtype verdc;
  sunrealtype horac;
  sunrealtype hordc;
  sunrealtype *kthCol;
  int k;
  int j;
  int i;
  int local_40;
  int local_3c;
  
  dVar1 = *(double *)(in_R8 + 0x10);
  dVar2 = *(double *)(in_R8 + 0x18);
  dVar3 = *(double *)(in_R8 + 0x20);
  for (local_40 = 1; local_40 < 0x15; local_40 = local_40 + 1) {
    for (local_3c = 1; local_3c < 0x29; local_3c = local_3c + 1) {
      pdVar4 = (double *)SUNBandMatrix_Column(in_RCX,(long)(local_40 + -1 + (local_3c + -1) * 0x14))
      ;
      *pdVar4 = (dVar3 + dVar1) * 2.0;
      if (local_3c != 1) {
        pdVar4[-0x14] = -dVar1 + dVar2;
      }
      if (local_3c != 0x28) {
        pdVar4[0x14] = -dVar1 - dVar2;
      }
      if (local_40 != 1) {
        pdVar4[-1] = -dVar3;
      }
      if (local_40 != 0x14) {
        pdVar4[1] = -dVar3;
      }
    }
  }
  return 0;
}

Assistant:

static int JacB(sunrealtype tB, N_Vector u, N_Vector uB, N_Vector fuB,
                SUNMatrix JB, void* user_dataB, N_Vector tmp1B, N_Vector tmp2B,
                N_Vector tmp3B)
{
  int i, j, k;
  sunrealtype *kthCol, hordc, horac, verdc;
  UserData data;

  /* The Jacobian of the adjoint system is: JB = -J^T */

  data  = (UserData)user_dataB;
  hordc = data->hdcoef;
  horac = data->hacoef;
  verdc = data->vdcoef;

  for (j = 1; j <= MY; j++)
  {
    for (i = 1; i <= MX; i++)
    {
      k      = j - 1 + (i - 1) * MY;
      kthCol = SUNBandMatrix_Column(JB, k);

      /* set the kth column of J */

      SM_COLUMN_ELEMENT_B(kthCol, k, k) = TWO * (verdc + hordc);
      if (i != 1) { SM_COLUMN_ELEMENT_B(kthCol, k - MY, k) = -hordc + horac; }
      if (i != MX) { SM_COLUMN_ELEMENT_B(kthCol, k + MY, k) = -hordc - horac; }
      if (j != 1) { SM_COLUMN_ELEMENT_B(kthCol, k - 1, k) = -verdc; }
      if (j != MY) { SM_COLUMN_ELEMENT_B(kthCol, k + 1, k) = -verdc; }
    }
  }

  return (0);
}